

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O2

number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::maxAbsColscale(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *__return_storage_ptr__,
                SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this)

{
  DataArray<int> *pDVar1;
  type_conflict5 tVar2;
  double in_RAX;
  int i;
  long lVar3;
  double dVar4;
  double local_28;
  
  pDVar1 = this->m_activeColscaleExp;
  local_28 = in_RAX;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
            (&__return_storage_ptr__->m_backend,0.0,(type *)0x0);
  for (lVar3 = 0; lVar3 < pDVar1->thesize; lVar3 = lVar3 + 1) {
    local_28 = ldexp(1.0,pDVar1->data[lVar3]);
    local_28 = ABS(local_28);
    tVar2 = boost::multiprecision::operator>(&local_28,__return_storage_ptr__);
    if (tVar2) {
      dVar4 = ldexp(1.0,pDVar1->data[lVar3]);
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)__return_storage_ptr__,ABS(dVar4));
    }
  }
  return __return_storage_ptr__;
}

Assistant:

R SPxScaler<R>::maxAbsColscale() const
{
   const DataArray < int >& colscaleExp = *m_activeColscaleExp;

   R maxi = 0.0;

   for(int i = 0; i < colscaleExp.size(); ++i)
      if(spxAbs(spxLdexp(1.0, colscaleExp[i])) > maxi)
         maxi = spxAbs(spxLdexp(1.0, colscaleExp[i]));


   return maxi;
}